

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMap.h
# Opt level: O1

pair<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_bool>
 __thiscall
llvm::
StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
::try_emplace<>(StringMap<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_llvm::MallocAllocator>
                *this,StringRef Key)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  StringMapEntryBase *pSVar4;
  size_t __n;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
  SVar6;
  size_t KeyLength;
  pair<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_bool>
  pVar7;
  
  __n = Key.Length;
  uVar2 = StringMapImpl::LookupBucketFor(&this->super_StringMapImpl,Key);
  SVar6.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
  if (*SVar6.Ptr == (StringMapEntryBase *)0xfffffffffffffff8) {
    puVar1 = &(this->super_StringMapImpl).NumTombstones;
    *puVar1 = *puVar1 - 1;
  }
  else if (*SVar6.Ptr != (StringMapEntryBase *)0x0) {
    for (; (*SVar6.Ptr == (StringMapEntryBase *)0x0 ||
           (*SVar6.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar6.Ptr = SVar6.Ptr + 1) {
    }
    uVar5 = 0;
    goto LAB_00c921f8;
  }
  pSVar4 = (StringMapEntryBase *)
           MallocAllocator::Allocate((MallocAllocator *)&this->field_0x18,__n + 0x11,8);
  pSVar4->StrLen = __n;
  pSVar4[1].StrLen = 0;
  if (__n != 0) {
    memcpy(pSVar4 + 2,Key.Data,__n);
  }
  *(undefined1 *)((long)&pSVar4[2].StrLen + __n) = 0;
  *SVar6.Ptr = pSVar4;
  uVar3 = (this->super_StringMapImpl).NumItems + 1;
  (this->super_StringMapImpl).NumItems = uVar3;
  if ((this->super_StringMapImpl).NumBuckets < uVar3 + (this->super_StringMapImpl).NumTombstones) {
    __assert_fail("NumItems + NumTombstones <= NumBuckets",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringMap.h"
                  ,0x1bb,
                  "std::pair<iterator, bool> llvm::StringMap<std::unique_ptr<llvm::MemoryBuffer>>::try_emplace(StringRef, ArgsTy &&...) [ValueTy = std::unique_ptr<llvm::MemoryBuffer>, AllocatorTy = llvm::MallocAllocator, ArgsTy = <>]"
                 );
  }
  uVar2 = StringMapImpl::RehashTable(&this->super_StringMapImpl,uVar2);
  for (SVar6.Ptr = (this->super_StringMapImpl).TheTable + uVar2;
      (*SVar6.Ptr == (StringMapEntryBase *)0x0 ||
      (*SVar6.Ptr == (StringMapEntryBase *)0xfffffffffffffff8)); SVar6.Ptr = SVar6.Ptr + 1) {
  }
  uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
LAB_00c921f8:
  pVar7._8_8_ = uVar5;
  pVar7.first.
  super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
  .Ptr = (StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
          )(StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>,_llvm::StringMapEntry<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_>
            )SVar6.Ptr;
  return pVar7;
}

Assistant:

std::pair<iterator, bool> try_emplace(StringRef Key, ArgsTy &&... Args) {
    unsigned BucketNo = LookupBucketFor(Key);
    StringMapEntryBase *&Bucket = TheTable[BucketNo];
    if (Bucket && Bucket != getTombstoneVal())
      return std::make_pair(iterator(TheTable + BucketNo, false),
                            false); // Already exists in map.

    if (Bucket == getTombstoneVal())
      --NumTombstones;
    Bucket = MapEntryTy::Create(Key, Allocator, std::forward<ArgsTy>(Args)...);
    ++NumItems;
    assert(NumItems + NumTombstones <= NumBuckets);

    BucketNo = RehashTable(BucketNo);
    return std::make_pair(iterator(TheTable + BucketNo, false), true);
  }